

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O0

string * __thiscall helics::TimeCoordinator::printTimeStatus_abi_cxx11_(TimeCoordinator *this)

{
  string_view fmt;
  string *in_RDI;
  format_args in_stack_00000060;
  size_t in_stack_00000078;
  double local_1e8;
  double local_1e0;
  double local_1d8;
  double local_1d0;
  double local_1c8;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  char *local_1a8;
  undefined8 local_1a0;
  double local_188 [2];
  double local_178 [2];
  double local_168 [2];
  double local_158 [2];
  double local_148 [2];
  double local_138 [2];
  double local_128 [2];
  undefined1 local_118 [16];
  undefined8 local_108;
  double *local_100;
  char *local_f8;
  undefined8 local_f0;
  double *local_e8;
  double *local_e0;
  double *local_d8;
  double *local_d0;
  double *local_c8;
  double *local_c0;
  double *local_b8;
  double *local_b0;
  char *local_a8;
  undefined8 local_a0;
  undefined1 *local_88;
  double local_80;
  double *local_78;
  double local_70;
  double *local_68;
  double local_60;
  double *local_58;
  double local_50;
  double *local_48;
  double local_40;
  double *local_38;
  double local_30;
  double *local_28;
  double local_20;
  double *local_18;
  double *local_10;
  undefined8 *local_8;
  
  local_1a8 = 
  "{{\"granted_time\":{},\"requested_time\":{}, \"exec\":{}, \"allow\":{}, \"value\":{}, \"message\":{}, \"minDe\":{}, \"minminDe\":{}}}"
  ;
  local_1a0 = 0x75;
  local_1b0 = TimeRepresentation::operator_cast_to_double
                        ((TimeRepresentation<count_time<9,_long>_> *)0x61ff59);
  local_1b8 = TimeRepresentation::operator_cast_to_double
                        ((TimeRepresentation<count_time<9,_long>_> *)0x61ff70);
  local_1c0 = TimeRepresentation::operator_cast_to_double
                        ((TimeRepresentation<count_time<9,_long>_> *)0x61ff87);
  local_1c8 = TimeRepresentation::operator_cast_to_double
                        ((TimeRepresentation<count_time<9,_long>_> *)0x61ff9e);
  local_1d0 = TimeRepresentation::operator_cast_to_double
                        ((TimeRepresentation<count_time<9,_long>_> *)0x61ffb5);
  local_1d8 = TimeRepresentation::operator_cast_to_double
                        ((TimeRepresentation<count_time<9,_long>_> *)0x61ffcc);
  local_1e0 = TimeRepresentation::operator_cast_to_double
                        ((TimeRepresentation<count_time<9,_long>_> *)0x61ffe3);
  local_1e8 = TimeRepresentation::operator_cast_to_double
                        ((TimeRepresentation<count_time<9,_long>_> *)0x61fffa);
  local_a8 = local_1a8;
  local_a0 = local_1a0;
  local_b0 = &local_1b0;
  local_b8 = &local_1b8;
  local_c0 = &local_1c0;
  local_c8 = &local_1c8;
  local_d0 = &local_1d0;
  local_d8 = &local_1d8;
  local_e0 = &local_1e0;
  local_e8 = &local_1e8;
  local_f8 = local_1a8;
  local_f0 = local_1a0;
  local_20 = local_1b0;
  local_18 = local_188;
  local_188[0] = local_1b0;
  local_28 = local_178;
  local_30 = local_1b8;
  local_38 = local_168;
  local_40 = local_1c0;
  local_48 = local_158;
  local_50 = local_1c8;
  local_58 = local_148;
  local_60 = local_1d0;
  local_68 = local_138;
  local_70 = local_1d8;
  local_78 = local_128;
  local_80 = local_1e0;
  local_88 = local_118;
  local_8 = &local_108;
  local_10 = local_188;
  local_108 = 0xaaaaaaaa;
  fmt.size_ = in_stack_00000078;
  fmt.data_ = (char *)this;
  local_178[0] = local_30;
  local_168[0] = local_40;
  local_158[0] = local_50;
  local_148[0] = local_60;
  local_138[0] = local_70;
  local_128[0] = local_80;
  local_100 = local_10;
  ::fmt::v11::vformat_abi_cxx11_(fmt,in_stack_00000060);
  return in_RDI;
}

Assistant:

std::string TimeCoordinator::printTimeStatus() const
{
    return fmt::format(
        R"raw({{"granted_time":{},"requested_time":{}, "exec":{}, "allow":{}, "value":{}, "message":{}, "minDe":{}, "minminDe":{}}})raw",
        static_cast<double>(time_granted),
        static_cast<double>(time_requested),
        static_cast<double>(time_exec),
        static_cast<double>(time_allow),
        static_cast<double>(time_value),
        static_cast<double>(time_message),
        static_cast<double>(time_minDe),
        static_cast<double>(time_minminDe));
}